

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O2

void __thiscall CompilationContext::inverseWarningsSuppression(CompilationContext *this)

{
  int *piVar1;
  pointer piVar2;
  long lVar3;
  int i;
  long lVar4;
  vector<int,_std::allocator<int>_> newSuppressWarnings;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = 0;
  do {
    if (lVar4 == 0x59) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&this->suppressWarnings,(vector<int,_std::allocator<int>_> *)&local_38);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
      return;
    }
    piVar2 = (this->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      if ((long)(this->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2 >> 2 == lVar3) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_38,&analyzer_messages[lVar4].intId);
        break;
      }
      piVar1 = piVar2 + lVar3;
      lVar3 = lVar3 + 1;
    } while (analyzer_messages[lVar4].intId != *piVar1);
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void CompilationContext::inverseWarningsSuppression()
{
  std::vector<int> newSuppressWarnings;
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
  {
    bool found = false;
    for (size_t j = 0; j < suppressWarnings.size(); j++)
    {
      if (analyzer_messages[i].intId == suppressWarnings[j])
      {
        found = true;
        break;
      }
    }

    if (!found)
      newSuppressWarnings.push_back(analyzer_messages[i].intId);
  }

  suppressWarnings = newSuppressWarnings;
}